

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O2

void Saig_StrSimSetInitMatching(Aig_Man_t *p0,Aig_Man_t *p1)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  int i;
  
  pAVar1 = p0->pConst1;
  pAVar2 = p1->pConst1;
  Aig_ObjSetRepr(p0,pAVar1,pAVar2);
  Aig_ObjSetRepr(p1,pAVar2,pAVar1);
  for (i = 0; i < p0->nTruePis; i = i + 1) {
    pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(p0->vCis,i);
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p1->vCis,i);
    Aig_ObjSetRepr(p0,pAVar1,pAVar2);
    Aig_ObjSetRepr(p1,pAVar2,pAVar1);
  }
  return;
}

Assistant:

void Saig_StrSimSetInitMatching( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Obj_t * pObj0, * pObj1;
    int i;
    pObj0 = Aig_ManConst1( p0 );
    pObj1 = Aig_ManConst1( p1 );
    Aig_ObjSetRepr( p0, pObj0, pObj1 );
    Aig_ObjSetRepr( p1, pObj1, pObj0 );
    Saig_ManForEachPi( p0, pObj0, i )
    {
        pObj1 = Aig_ManCi( p1, i );
        Aig_ObjSetRepr( p0, pObj0, pObj1 );
        Aig_ObjSetRepr( p1, pObj1, pObj0 );
    }
}